

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void __thiscall
testing::internal::MatcherBase<solitaire::piles::PileId>::~MatcherBase
          (MatcherBase<solitaire::piles::PileId> *this)

{
  (this->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_002e9368;
  Destroy(this);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }